

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O1

void __thiscall lsim::Simulator::postprocess_dirty_nodes(Simulator *this)

{
  pointer pNVar1;
  Value VVar2;
  uint *puVar3;
  pointer pNVar4;
  size_t sVar5;
  pointer pVVar6;
  iterator __position;
  pointer puVar7;
  uint *puVar8;
  uint node_id;
  uint local_2c;
  
  puVar8 = (this->m_dirty_nodes_write).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->m_dirty_nodes_write).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar8 != puVar3) {
    do {
      local_2c = *puVar8;
      pNVar4 = (this->m_node_metadata).
               super__Vector_base<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>._M_impl.
               super__Vector_impl_data._M_start;
      pNVar1 = pNVar4 + local_2c;
      sVar5 = *(size_t *)((long)&pNVar4[local_2c].m_active_pins._M_t._M_impl + 0x28);
      if (sVar5 == 1) {
        (this->m_node_values_write).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>.
        _M_impl.super__Vector_impl_data._M_start[local_2c] =
             (this->m_pin_values).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>.
             _M_impl.super__Vector_impl_data._M_start
             [(*(_Base_ptr *)((long)&(pNVar1->m_active_pins)._M_t._M_impl + 0x18))[1]._M_color];
LAB_00177c74:
        (this->m_node_write_time).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start[local_2c] = this->m_time;
      }
      else {
        if (sVar5 == 0) {
          (this->m_node_values_write).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>.
          _M_impl.super__Vector_impl_data._M_start[local_2c] = pNVar1->m_default;
          goto LAB_00177c74;
        }
        (this->m_node_values_write).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>.
        _M_impl.super__Vector_impl_data._M_start[local_2c] = VALUE_ERROR;
      }
      pVVar6 = (this->m_node_values_read).
               super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>._M_impl.
               super__Vector_impl_data._M_start;
      VVar2 = (this->m_node_values_write).
              super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>._M_impl.
              super__Vector_impl_data._M_start[local_2c];
      if (pVVar6[local_2c] != VVar2) {
        (this->m_node_change_time).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
        ._M_impl.super__Vector_impl_data._M_start[local_2c] = this->m_time;
        pVVar6[local_2c] = VVar2;
        __position._M_current =
             (this->m_dirty_nodes_read).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_dirty_nodes_read).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_dirty_nodes_read,
                     __position,&local_2c);
        }
        else {
          *__position._M_current = local_2c;
          (this->m_dirty_nodes_read).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
          ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar3);
  }
  puVar7 = (this->m_dirty_nodes_write).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_dirty_nodes_write).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar7) {
    (this->m_dirty_nodes_write).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar7;
  }
  return;
}

Assistant:

void Simulator::postprocess_dirty_nodes() {

    for (auto node_id : m_dirty_nodes_write) {

        switch (m_node_metadata[node_id].m_active_pins.size()) {
            case 0 :        // no active writers: use default value (i.e. pull-up/down resistor)
                m_node_values_write[node_id] = m_node_metadata[node_id].m_default;
                m_node_write_time[node_id] = m_time;
                break;
            case 1 : {      // normal case - 1 active writer
                pin_t pin = *m_node_metadata[node_id].m_active_pins.begin();
                m_node_values_write[node_id] = m_pin_values[pin];
                m_node_write_time[node_id] = m_time;
                break;
            }
            default :       // multiple active writers
               m_node_values_write[node_id] = VALUE_ERROR;
               break;
        }

        if (m_node_values_read[node_id] != m_node_values_write[node_id]) {
            m_node_change_time[node_id] = m_time;
            m_node_values_read[node_id] = m_node_values_write[node_id];
            m_dirty_nodes_read.push_back(node_id);
        }
    }

    m_dirty_nodes_write.clear();
}